

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O2

void run_test<unsigned_long>(void)

{
  DivideTest<unsigned_long> dt;
  char msg [64];
  
  snprintf(msg,0x40,"Testing %s\n","uint64_t");
  std::operator<<((ostream *)&std::cout,msg);
  DivideTest<unsigned_long>::DivideTest(&dt);
  DivideTest<unsigned_long>::run(&dt);
  return;
}

Assistant:

void run_test() {
    char msg[64];
    snprintf(msg, sizeof(msg), "Testing %s\n", type_name<T>::get_name());
    PRINT_INFO(msg);
    DivideTest<T> dt;
    dt.run();
}